

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall
wallet::CWallet::AddToSpends(CWallet *this,COutPoint *outpoint,uint256 *wtxid,WalletBatch *batch)

{
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  range_00;
  CWallet *in_RCX;
  __node_type *in_RDI;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  range;
  WalletBatch temp_batch;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  WalletDatabase *in_stack_ffffffffffffff10;
  key_type *__x;
  CWallet *in_stack_ffffffffffffff18;
  COutPoint *output;
  CWallet *in_stack_ffffffffffffff30;
  _Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> _Var1;
  _Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> local_70;
  __atomic_base<long> local_8;
  
  local_8._M_i = *(long *)(in_FS_OFFSET + 0x28);
  output = (COutPoint *)
           ((long)&in_RDI[1].super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>.
                   super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                   _M_storage + 0x10);
  _Var1._M_cur = in_RDI;
  std::make_pair<COutPoint_const&,uint256_const&>
            ((COutPoint *)in_stack_ffffffffffffff18,(uint256 *)in_stack_ffffffffffffff10);
  std::
  unordered_multimap<COutPoint,uint256,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<std::pair<COutPoint_const,uint256>>>
  ::insert<std::pair<COutPoint,uint256>>
            ((unordered_multimap<COutPoint,_uint256,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<std::pair<const_COutPoint,_uint256>_>_>
              *)in_stack_ffffffffffffff10,
             (pair<COutPoint,_uint256> *)
             CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  if (in_RCX == (CWallet *)0x0) {
    GetDatabase(in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff18 = (CWallet *)&stack0xffffffffffffffa0;
    WalletBatch::WalletBatch
              ((WalletBatch *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               (bool)in_stack_ffffffffffffff0f);
    UnlockCoin(in_stack_ffffffffffffff30,output,(WalletBatch *)in_RDI);
    WalletBatch::~WalletBatch
              ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  }
  else {
    UnlockCoin(in_stack_ffffffffffffff30,output,(WalletBatch *)in_RDI);
  }
  __x = (key_type *)&local_70;
  std::
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  ::
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_true>
            ((pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
              *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  std::
  unordered_multimap<COutPoint,_uint256,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<std::pair<const_COutPoint,_uint256>_>_>
  ::equal_range((unordered_multimap<COutPoint,_uint256,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<std::pair<const_COutPoint,_uint256>_>_>
                 *)in_stack_ffffffffffffff18,__x);
  std::
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  ::operator=((pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
               *)in_stack_ffffffffffffff18,(type)__x);
  range_00.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur =
       local_70.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur;
  range_00.first.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)
       (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var1._M_cur;
  SyncMetaData(in_RCX,range_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8._M_i) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::AddToSpends(const COutPoint& outpoint, const uint256& wtxid, WalletBatch* batch)
{
    mapTxSpends.insert(std::make_pair(outpoint, wtxid));

    if (batch) {
        UnlockCoin(outpoint, batch);
    } else {
        WalletBatch temp_batch(GetDatabase());
        UnlockCoin(outpoint, &temp_batch);
    }

    std::pair<TxSpends::iterator, TxSpends::iterator> range;
    range = mapTxSpends.equal_range(outpoint);
    SyncMetaData(range);
}